

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas2_d.cpp
# Opt level: O2

void dtrmv(char uplo,char trans,char diag,int n,double *a,int lda,double *x,int incx)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined4 in_register_0000000c;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  double *pdVar12;
  ulong uVar13;
  double dVar14;
  string local_80;
  ulong local_60;
  ulong local_58;
  allocator<char> local_49;
  int local_48;
  int local_44;
  double *local_40;
  char local_31;
  
  local_60 = CONCAT44(in_register_0000000c,n);
  local_40 = a;
  bVar1 = lsame(uplo,'U');
  if ((bVar1) || (bVar1 = lsame(uplo,'L'), bVar1)) {
    bVar1 = lsame(trans,'N');
    if ((bVar1) || ((bVar1 = lsame(trans,'T'), bVar1 || (bVar1 = lsame(trans,'C'), bVar1)))) {
      bVar1 = lsame(diag,'U');
      if ((bVar1) || (bVar1 = lsame(diag,'N'), bVar1)) {
        if ((int)local_60 < 0) {
          iVar3 = 4;
        }
        else {
          local_48 = 1;
          iVar3 = i4_max(1,(int)local_60);
          if (lda < iVar3) {
            iVar3 = 6;
          }
          else {
            local_58 = (ulong)(uint)lda;
            if (incx != 0) {
              iVar3 = (int)local_60;
              if (iVar3 == 0) {
                return;
              }
              local_31 = lsame(diag,'N');
              local_44 = 0;
              if (incx < 1) {
                local_44 = (1 - iVar3) * incx;
              }
              bVar1 = lsame(trans,'N');
              bVar2 = lsame(uplo,'U');
              iVar3 = (int)local_58;
              iVar11 = (int)local_60;
              if (!bVar1) {
                if (!bVar2) {
                  local_60 = local_60 & 0xffffffff;
                  if (incx == 1) {
                    iVar11 = 1;
                    pdVar7 = local_40;
                    for (uVar10 = 0; uVar10 != local_60; uVar10 = uVar10 + 1) {
                      dVar14 = x[uVar10];
                      if (local_31 != '\0') {
                        dVar14 = dVar14 * local_40[(iVar3 + 1) * (int)uVar10];
                      }
                      for (lVar6 = (long)iVar11; lVar6 < (long)local_60; lVar6 = lVar6 + 1) {
                        dVar14 = dVar14 + pdVar7[lVar6] * x[lVar6];
                      }
                      x[uVar10] = dVar14;
                      iVar11 = iVar11 + 1;
                      pdVar7 = pdVar7 + iVar3;
                    }
                    return;
                  }
                  lVar6 = (long)local_44;
                  lVar5 = (long)incx;
                  pdVar12 = x + lVar6 + lVar5;
                  pdVar7 = local_40;
                  for (uVar10 = 0; uVar10 != local_60; uVar10 = uVar10 + 1) {
                    dVar14 = x[lVar6];
                    if (local_31 != '\0') {
                      dVar14 = dVar14 * local_40[(iVar3 + 1) * (int)uVar10];
                    }
                    pdVar8 = pdVar12;
                    for (lVar9 = (long)local_48; lVar9 < (long)local_60; lVar9 = lVar9 + 1) {
                      dVar14 = dVar14 + pdVar7[lVar9] * *pdVar8;
                      pdVar8 = pdVar8 + lVar5;
                    }
                    x[lVar6] = dVar14;
                    lVar6 = lVar6 + lVar5;
                    local_48 = local_48 + 1;
                    pdVar7 = pdVar7 + iVar3;
                    pdVar12 = pdVar12 + lVar5;
                  }
                  return;
                }
                if (incx == 1) {
                  lVar5 = (long)iVar11;
                  lVar6 = lVar5 + -2;
                  local_60 = local_60 & 0xffffffff;
                  pdVar7 = local_40 + (local_60 - 1) * (long)iVar3 + lVar5 + -2;
                  pdVar12 = x + lVar5 + -2;
                  while (0 < (long)local_60) {
                    local_60 = local_60 - 1;
                    dVar14 = x[local_60];
                    if (local_31 != '\0') {
                      dVar14 = dVar14 * local_40[(iVar3 + 1) * (int)local_60];
                    }
                    for (lVar5 = 0; -1 < lVar6 + lVar5; lVar5 = lVar5 + -1) {
                      dVar14 = dVar14 + pdVar7[lVar5] * pdVar12[lVar5];
                    }
                    x[local_60] = dVar14;
                    lVar6 = lVar6 + -1;
                    pdVar7 = pdVar7 + ~(long)iVar3;
                    pdVar12 = pdVar12 + -1;
                  }
                  return;
                }
                iVar4 = (iVar11 + -1) * incx + local_44;
                local_60 = local_60 & 0xffffffff;
                pdVar7 = local_40 + (local_60 - 1) * (long)iVar3 + local_60;
                local_44 = (iVar11 + -2) * incx + local_44;
                while (0 < (long)local_60) {
                  dVar14 = x[iVar4];
                  lVar6 = -1;
                  iVar11 = local_44;
                  if (local_31 != '\0') {
                    dVar14 = dVar14 * local_40[(iVar3 + 1) * (int)(local_60 - 1)];
                  }
                  for (; 0 < (long)(local_60 + lVar6); lVar6 = lVar6 + -1) {
                    dVar14 = dVar14 + pdVar7[lVar6 + -1] * x[iVar11];
                    iVar11 = iVar11 - incx;
                  }
                  x[iVar4] = dVar14;
                  iVar4 = iVar4 - incx;
                  pdVar7 = pdVar7 + ~(long)iVar3;
                  local_44 = local_44 - incx;
                  local_60 = local_60 - 1;
                }
                return;
              }
              if (!bVar2) {
                if (incx == 1) {
                  lVar5 = (local_60 & 0xffffffff) - 1;
                  pdVar7 = local_40 + lVar5 * iVar3;
                  for (lVar6 = lVar5; -1 < lVar6; lVar6 = lVar6 + -1) {
                    dVar14 = x[lVar6];
                    lVar9 = lVar5;
                    if ((dVar14 != 0.0) || (NAN(dVar14))) {
                      for (; lVar6 < lVar9; lVar9 = lVar9 + -1) {
                        x[lVar9] = pdVar7[lVar9] * dVar14 + x[lVar9];
                      }
                      if (local_31 != '\0') {
                        x[lVar6] = x[lVar6] * local_40[(iVar3 + 1) * (int)lVar6];
                      }
                    }
                    pdVar7 = pdVar7 + -(long)iVar3;
                  }
                  return;
                }
                local_44 = local_44 + (iVar11 + -1) * incx;
                lVar5 = (local_60 & 0xffffffff) - 1;
                pdVar7 = local_40 + lVar5 * iVar3;
                iVar11 = local_44;
                for (lVar6 = lVar5; -1 < lVar6; lVar6 = lVar6 + -1) {
                  dVar14 = x[iVar11];
                  lVar9 = lVar5;
                  iVar4 = local_44;
                  if ((dVar14 != 0.0) || (NAN(dVar14))) {
                    for (; lVar6 < lVar9; lVar9 = lVar9 + -1) {
                      x[iVar4] = pdVar7[lVar9] * dVar14 + x[iVar4];
                      iVar4 = iVar4 - incx;
                    }
                    if (local_31 != '\0') {
                      x[iVar11] = x[iVar11] * local_40[(iVar3 + 1) * (int)lVar6];
                    }
                  }
                  iVar11 = iVar11 - incx;
                  pdVar7 = pdVar7 + -(long)iVar3;
                }
                return;
              }
              if (incx == 1) {
                pdVar7 = local_40;
                for (uVar10 = 0; uVar10 != (local_60 & 0xffffffff); uVar10 = uVar10 + 1) {
                  dVar14 = x[uVar10];
                  if ((dVar14 != 0.0) || (NAN(dVar14))) {
                    for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
                      x[uVar13] = pdVar7[uVar13] * dVar14 + x[uVar13];
                    }
                    if (local_31 != '\0') {
                      x[uVar10] = x[uVar10] * local_40[(iVar3 + 1) * (int)uVar10];
                    }
                  }
                  pdVar7 = pdVar7 + iVar3;
                }
                return;
              }
              lVar6 = (long)local_44;
              pdVar12 = x + lVar6;
              pdVar7 = local_40;
              for (uVar10 = 0; uVar10 != (local_60 & 0xffffffff); uVar10 = uVar10 + 1) {
                dVar14 = x[lVar6];
                if ((dVar14 != 0.0) || (NAN(dVar14))) {
                  pdVar8 = pdVar12;
                  for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
                    *pdVar8 = pdVar7[uVar13] * dVar14 + *pdVar8;
                    pdVar8 = pdVar8 + incx;
                  }
                  if (local_31 != '\0') {
                    x[lVar6] = x[lVar6] * local_40[(iVar3 + 1) * (int)uVar10];
                  }
                }
                lVar6 = lVar6 + incx;
                pdVar7 = pdVar7 + iVar3;
              }
              return;
            }
            iVar3 = 8;
          }
        }
      }
      else {
        iVar3 = 3;
      }
    }
    else {
      iVar3 = 2;
    }
  }
  else {
    iVar3 = 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"DTRMV",&local_49);
  xerbla(&local_80,iVar3);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void dtrmv ( char uplo, char trans, char diag, int n, double a[], int lda, 
  double x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    DTRMV computes x: = A*x or x = A'*x for a triangular matrix A.
//
//  Discussion:
//
//    DTRMV performs one of the matrix-vector operations
//
//      x := A*x,   or   x := A'*x,
//
//    where x is an n element vector and  A is an n by n unit, or non-unit,
//    upper or lower triangular matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    04 April 2014
//
//  Author:
//
//    This C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, char UPLO, specifies whether the matrix is an upper or
//    lower triangular matrix as follows:
//    'u' or 'U': A is an upper triangular matrix.
//    'l' or 'L': A is a lower triangular matrix.
//
//    Input, char TRANS, specifies the operation to be performed as
//    follows:
//    'n' or 'N': x := A*x.
//    't' or 'T': x := A'*x.
//    'c' or 'C': x := A'*x.
//
//    Input, char DIAG, specifies whether or not A is unit
//    triangular as follows:
//    'u' or 'U': A is assumed to be unit triangular.
//    'n' or 'N': A is not assumed to be unit triangular.
//
//    Input, int N, the order of the matrix A.
//    0 <= N.
//
//    Input, double A[LDA*N].
//    Before entry with  UPLO = 'u' or 'U', the leading n by n
//    upper triangular part of the array A must contain the upper
//    triangular matrix and the strictly lower triangular part of
//    A is not referenced.
//    Before entry with UPLO = 'l' or 'L', the leading n by n
//    lower triangular part of the array A must contain the lower
//    triangular matrix and the strictly upper triangular part of
//    A is not referenced.
//    Note that when  DIAG = 'u' or 'U', the diagonal elements of
//    A are not referenced either, but are assumed to be unity.
//
//    Input, int LDA, the first dimension of A as declared
//    in the calling program. max ( 1, N ) <= LDA.
//
//    Input/output, double X[1+(N-1)*abs( INCX)].
//    Before entry, the incremented array X must contain the n
//    element vector x. On exit, X is overwritten with the
//    tranformed vector x.
//
//    Input, int INCX, the increment for the elements of
//    X.  INCX must not be zero.
//
{
  int i;
  int info;
  int ix;
  int j;
  int jx;
  int kx = 0;
  bool nounit;
  double temp;
//
//  Test the input parameters.
//
  info = 0;
  if  ( ! lsame ( uplo, 'U' ) && ! lsame ( uplo, 'L' )  )
  {
    info = 1;
  }
  else if ( ! lsame ( trans, 'N' ) && ! lsame ( trans, 'T' ) && 
            ! lsame ( trans, 'C' ) )
  {
    info = 2;
  }
  else if ( ! lsame ( diag, 'U' ) && ! lsame ( diag, 'N' ) )
  {
    info = 3;
  }
  else if ( n < 0 )
  {
    info = 4;
  }
  else if ( lda < i4_max ( 1, n ) )
  {
    info = 6;
  }
  else if ( incx == 0 )
  {
    info = 8;
  }

  if ( info != 0 )
  {
    xerbla ( "DTRMV", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( n == 0 ) 
  {
    return;
  }

  nounit = lsame ( diag, 'N' );
//
//  Set up the start point in X if the increment is not unity. This
//  will be  ( N - 1 ) * INCX  too small for descending loops.
//
  if ( incx <= 0 )
  {
    kx = 0 - ( n - 1 ) * incx;
  }
  else if ( incx != 1 )
  {
    kx = 0;
  }
//
//  Start the operations. In this version the elements of A are
//  accessed sequentially with one pass through A.
//
  if ( lsame ( trans, 'N' ) )
  {
//
//  Form x := A*x.
//
    if ( lsame ( uplo, 'U' ) )
    {
      if ( incx == 1 )
      {
        for ( j = 0; j < n; j++ )
        {
          if ( x[j] != 0.0 )
          {
            temp = x[j];
            for ( i = 0; i < j; i++ )
            {
              x[i] = x[i] + temp * a[i+j*lda];
            }
            if ( nounit )
            {
              x[j] = x[j] * a[j+j*lda];
            }
          }
        }
      }
      else
      {
        jx = kx;
        for ( j = 0; j < n; j++ )
        {
          if ( x[jx] != 0.0 )
          {
            temp = x[jx];
            ix = kx;
            for ( i = 0; i < j; i++ )
            {
              x[ix] = x[ix] + temp * a[i+j*lda];
              ix = ix + incx;
            }
            if ( nounit )
            {
              x[jx] = x[jx] * a[j+j*lda];
            }
          }
          jx = jx + incx;
        }
      }
    }
    else
    {
      if ( incx == 1 )
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          if ( x[j] != 0.0 )
          {
            temp = x[j];
            for ( i = n - 1; j < i; i-- )
            {
              x[i] = x[i] + temp * a[i+j*lda];
            }
            if ( nounit )
            {
              x[j] = x[j] * a[j+j*lda];
            }
          }
        }
      }
      else
      {
        kx = kx + ( n - 1 ) * incx;
        jx = kx;
        for ( j = n - 1; 0 <= j; j-- )
        {
          if ( x[jx] != 0.0 )
          {
            temp = x[jx];
            ix = kx;
            for ( i = n - 1; j < i; i-- )
            {
              x[ix] = x[ix] + temp * a[i+j*lda];
              ix = ix - incx;
            }
            if ( nounit )
            {
              x[jx] = x[jx] * a[j+j*lda];
            }
          }
          jx = jx - incx;
        }
      }
    }
  }
//
//  Form x := A'*x.
//
  else
  {
    if ( lsame ( uplo, 'U' ) )
    {
      if ( incx == 1 )
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          temp = x[j];
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j - 1; 0 <= i; i-- )
          {
            temp = temp + a[i+j*lda] * x[i];
          }
          x[j] = temp;
        }
      }
      else
      {
        jx = kx + ( n - 1 ) * incx;
        for ( j = n - 1; 0 <= j; j-- )
        {
          temp = x[jx];
          ix = jx;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j - 1; 0 <= i; i-- )
          {
            ix = ix - incx;
            temp = temp + a[i+j*lda] * x[ix];
          }
          x[jx] = temp;
          jx = jx - incx;
        }
      }
    }
    else
    {
      if ( incx == 1 )
      {
        for ( j = 0; j < n; j++ )
        {
          temp = x[j];
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j + 1; i < n; i++ )
          {
            temp = temp + a[i+j*lda] * x[i];
          }
          x[j] = temp;
        }
      }
      else
      {
        jx = kx;
        for ( j = 0; j < n; j++ )
        {
          temp = x[jx];
          ix = jx;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j + 1; i < n; i++ )
          {
            ix = ix + incx;
            temp = temp + a[i+j*lda] * x[ix];
          }
          x[jx] = temp;
          jx = jx + incx;
        }
      }
    }
  }

  return;
}